

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd.c
# Opt level: O2

gdImagePtr gdImageCreateFromGdCtx(gdIOCtxPtr in)

{
  int iVar1;
  int iVar2;
  gdImagePtr im;
  long lVar3;
  long lVar4;
  bool bVar5;
  int sx;
  int sy;
  int pix;
  
  iVar1 = gdGetWord(&sx,in);
  iVar2 = 0;
  if (iVar1 != 0) {
    bVar5 = false;
    if ((sx & 0xfffffffeU) == 0xfffe) {
      bVar5 = sx == 0xfffe;
      iVar2 = gdGetWord(&sx,in);
      if (iVar2 == 0) {
        return (gdImagePtr)0x0;
      }
      iVar2 = 1;
    }
    iVar1 = gdGetWord(&sy,in);
    if (iVar1 != 0) {
      if (bVar5) {
        im = gdImageCreateTrueColor(sx,sy);
      }
      else {
        im = gdImageCreate(sx,sy);
      }
      if (im != (gdImagePtr)0x0) {
        iVar2 = _gdGetColors(in,im,iVar2);
        if (iVar2 != 0) {
          if (im->trueColor == 0) {
            lVar3 = 0;
            do {
              if (sy <= lVar3) {
                return im;
              }
              for (lVar4 = 0; lVar4 < sx; lVar4 = lVar4 + 1) {
                iVar2 = gdGetC(in);
                if (iVar2 == -1) goto LAB_00114a1e;
                im->pixels[lVar3][lVar4] = (uchar)iVar2;
              }
              lVar3 = lVar3 + 1;
            } while( true );
          }
          lVar3 = 0;
          do {
            if (sy <= lVar3) {
              return im;
            }
            for (lVar4 = 0; lVar4 < sx; lVar4 = lVar4 + 1) {
              iVar2 = gdGetInt(&pix,in);
              if (iVar2 == 0) goto LAB_00114a1e;
              im->tpixels[lVar3][lVar4] = pix;
            }
            lVar3 = lVar3 + 1;
          } while( true );
        }
LAB_00114a1e:
        gdImageDestroy(im);
      }
    }
  }
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGdCtx (gdIOCtxPtr in)
{
	int sx, sy;
	int x, y;
	gdImagePtr im;

	/* Read the header */
	im = _gdCreateFromFile (in, &sx, &sy);

	if (im == NULL) {
		goto fail1;
	};

	/* Then the data... */
	/* 2.0.12: support truecolor properly in .gd as well as in .gd2.
	   Problem reported by Andreas Pfaller. */
	if (im->trueColor) {
		for (y = 0; (y < sy); y++) {
			for (x = 0; (x < sx); x++) {
				int pix;
				if (!gdGetInt (&pix, in)) {
					goto fail2;
				}
				im->tpixels[y][x] = pix;
			}
		}
	} else {
		for (y = 0; (y < sy); y++) {
			for (x = 0; (x < sx); x++) {
				int ch;
				ch = gdGetC (in);
				if (ch == EOF) {
					goto fail2;
				}
				/* ROW-MAJOR IN GD 1.3 */
				im->pixels[y][x] = ch;
			}
		}
	}
	return im;

fail2:
	gdImageDestroy (im);
fail1:
	return 0;
}